

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::TransitionTLASState
          (DeviceContextVkImpl *this,TopLevelASVkImpl *TLAS,RESOURCE_STATE OldState,
          RESOURCE_STATE NewState,bool UpdateInternalState)

{
  undefined *puVar1;
  bool bVar2;
  RESOURCE_STATE RVar3;
  VkAccessFlags srcAccessMask;
  VkAccessFlags dstAccessMask;
  VkPipelineStageFlags SrcStages;
  VkPipelineStageFlags DstStages;
  RenderPassVkImpl *pRVar4;
  Char *Message;
  TopLevelASDesc *pTVar5;
  undefined8 uVar6;
  RESOURCE_STATE State;
  RESOURCE_STATE State_00;
  undefined7 in_register_00000081;
  char (*Args_2) [68];
  char (*in_stack_fffffffffffffed8) [26];
  VkPipelineStageFlags NewStages;
  VkPipelineStageFlags OldStages;
  VkAccessFlags NewAccessFlags;
  VkAccessFlags OldAccessFlags;
  bool AfterWrite;
  String local_b8;
  undefined1 local_98 [8];
  string _msg_1;
  string _msg;
  undefined1 local_48 [8];
  string msg;
  RESOURCE_STATE RStack_1c;
  bool UpdateInternalState_local;
  RESOURCE_STATE NewState_local;
  RESOURCE_STATE OldState_local;
  TopLevelASVkImpl *TLAS_local;
  DeviceContextVkImpl *this_local;
  
  Args_2 = (char (*) [68])CONCAT71(in_register_00000081,UpdateInternalState);
  msg.field_2._M_local_buf[0xf] = UpdateInternalState;
  pRVar4 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                     ((RefCntAutoPtr *)
                      &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass);
  if (pRVar4 != (RenderPassVkImpl *)0x0) {
    FormatString<char[55]>
              ((string *)local_48,
               (char (*) [55])"State transitions are not allowed inside a render pass");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"TransitionTLASState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xcbc);
    std::__cxx11::string::~string((string *)local_48);
  }
  if (OldState == RESOURCE_STATE_UNKNOWN) {
    bVar2 = TopLevelASBase<Diligent::EngineVkImplTraits>::IsInKnownState
                      (&TLAS->super_TopLevelASBase<Diligent::EngineVkImplTraits>);
    if (!bVar2) {
      pTVar5 = DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
               ::GetDesc((DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
                          *)TLAS);
      FormatString<char[41],char_const*,char[68]>
                ((string *)((long)&_msg_1.field_2 + 8),
                 (Diligent *)"Failed to transition the state of TLAS \'",(char (*) [41])pTVar5,
                 (char **)"\' because the TLAS state is unknown and is not explicitly specified",
                 Args_2);
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar6 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(2,uVar6,0);
      }
      std::__cxx11::string::~string((string *)(_msg_1.field_2._M_local_buf + 8));
      return;
    }
    RStack_1c = TopLevelASBase<Diligent::EngineVkImplTraits>::GetState
                          (&TLAS->super_TopLevelASBase<Diligent::EngineVkImplTraits>);
  }
  else {
    bVar2 = TopLevelASBase<Diligent::EngineVkImplTraits>::IsInKnownState
                      (&TLAS->super_TopLevelASBase<Diligent::EngineVkImplTraits>);
    RStack_1c = OldState;
    if ((bVar2) &&
       (RVar3 = TopLevelASBase<Diligent::EngineVkImplTraits>::GetState
                          (&TLAS->super_TopLevelASBase<Diligent::EngineVkImplTraits>),
       RVar3 != OldState)) {
      RVar3 = TopLevelASBase<Diligent::EngineVkImplTraits>::GetState
                        (&TLAS->super_TopLevelASBase<Diligent::EngineVkImplTraits>);
      GetResourceStateString_abi_cxx11_(&local_b8,(Diligent *)(ulong)RVar3,State);
      pTVar5 = DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
               ::GetDesc((DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
                          *)TLAS);
      GetResourceStateString_abi_cxx11_
                ((String *)&OldAccessFlags,(Diligent *)(ulong)OldState,State_00);
      FormatString<char[11],std::__cxx11::string,char[11],char_const*,char[32],std::__cxx11::string,char[26]>
                ((string *)local_98,(Diligent *)"The state ",(char (*) [11])&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc26c39,
                 (char (*) [11])pTVar5,(char **)"\' does not match the old state ",
                 (char (*) [32])&OldAccessFlags,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " specified by the barrier",in_stack_fffffffffffffed8);
      std::__cxx11::string::~string((string *)&OldAccessFlags);
      std::__cxx11::string::~string((string *)&local_b8);
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar6 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(2,uVar6,0);
      }
      std::__cxx11::string::~string((string *)local_98);
    }
  }
  bVar2 = anon_unknown_511::ResourceStateHasWriteAccess(RStack_1c);
  RVar3 = Diligent::operator&(RStack_1c,NewState);
  if ((RVar3 != NewState) || (bVar2)) {
    EnsureVkCmdBuffer(this);
    srcAccessMask = AccelStructStateFlagsToVkAccessFlags(RStack_1c);
    dstAccessMask = AccelStructStateFlagsToVkAccessFlags(NewState);
    SrcStages = ResourceStateFlagsToVkPipelineStageFlags(RStack_1c);
    DstStages = ResourceStateFlagsToVkPipelineStageFlags(NewState);
    VulkanUtilities::VulkanCommandBuffer::MemoryBarrier
              (&this->m_CommandBuffer,srcAccessMask,dstAccessMask,SrcStages,DstStages);
    if ((msg.field_2._M_local_buf[0xf] & 1U) != 0) {
      TopLevelASBase<Diligent::EngineVkImplTraits>::SetState
                (&TLAS->super_TopLevelASBase<Diligent::EngineVkImplTraits>,NewState);
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::TransitionTLASState(TopLevelASVkImpl& TLAS,
                                              RESOURCE_STATE    OldState,
                                              RESOURCE_STATE    NewState,
                                              bool              UpdateInternalState)
{
    VERIFY(m_pActiveRenderPass == nullptr, "State transitions are not allowed inside a render pass");
    if (OldState == RESOURCE_STATE_UNKNOWN)
    {
        if (TLAS.IsInKnownState())
        {
            OldState = TLAS.GetState();
        }
        else
        {
            LOG_ERROR_MESSAGE("Failed to transition the state of TLAS '", TLAS.GetDesc().Name, "' because the TLAS state is unknown and is not explicitly specified");
            return;
        }
    }
    else
    {
        if (TLAS.IsInKnownState() && TLAS.GetState() != OldState)
        {
            LOG_ERROR_MESSAGE("The state ", GetResourceStateString(TLAS.GetState()), " of TLAS '",
                              TLAS.GetDesc().Name, "' does not match the old state ", GetResourceStateString(OldState),
                              " specified by the barrier");
        }
    }

    // Always add barrier after writes.
    const bool AfterWrite = ResourceStateHasWriteAccess(OldState);

    if ((OldState & NewState) != NewState || AfterWrite)
    {
        EnsureVkCmdBuffer();
        VkAccessFlags        OldAccessFlags = AccelStructStateFlagsToVkAccessFlags(OldState);
        VkAccessFlags        NewAccessFlags = AccelStructStateFlagsToVkAccessFlags(NewState);
        VkPipelineStageFlags OldStages      = ResourceStateFlagsToVkPipelineStageFlags(OldState);
        VkPipelineStageFlags NewStages      = ResourceStateFlagsToVkPipelineStageFlags(NewState);
        m_CommandBuffer.MemoryBarrier(OldAccessFlags, NewAccessFlags, OldStages, NewStages);
        if (UpdateInternalState)
        {
            TLAS.SetState(NewState);
        }
    }
}